

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  iVar3 = 0;
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar2 = (uint)*(undefined8 *)pObj;
    iVar3 = 1;
    if ((~uVar2 & 0x9fffffff) != 0) {
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaTim.c"
                      ,0x1d4,"int Gia_ManLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = Gia_ObjId(p,pObj);
      if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar1] != 0)) {
        iVar1 = Gia_ObjId(p,pObj);
        pObj_00 = Gia_ObjSiblObj(p,iVar1);
        Gia_ManLevelWithBoxes_rec(p,pObj_00);
      }
      iVar1 = Gia_ManLevelWithBoxes_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
      if (iVar1 == 0) {
        iVar1 = Gia_ManLevelWithBoxes_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff))
        ;
        if (iVar1 == 0) {
          if (((int)(uint)*(undefined8 *)pObj < 0) ||
             (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x23c,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar3 = Gia_ObjLevel(p,pObj + -(ulong)uVar2);
          iVar1 = Gia_ObjLevel(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
          if (iVar3 <= iVar1) {
            iVar3 = iVar1;
          }
          Gia_ObjSetLevel(p,pObj,iVar3 + 1);
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) );
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
        return 1;
    if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin1(pObj) ) )
        return 1;
    Gia_ObjSetAndLevel( p, pObj );
    return 0;
}